

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O0

void __thiscall
supermap::BST<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::add
          (BST<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *this,Key<2UL> *key,
          ByteArray<2UL> *value)

{
  ByteArray<2UL> *in_RDX;
  ByteArray<2UL> *in_RSI;
  
  std::
  map<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_std::less<supermap::Key<2UL>_>,_std::allocator<std::pair<const_supermap::Key<2UL>,_supermap::ByteArray<2UL>_>_>_>
  ::operator[]((map<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_std::less<supermap::Key<2UL>_>,_std::allocator<std::pair<const_supermap::Key<2UL>,_supermap::ByteArray<2UL>_>_>_>
                *)this,key);
  ByteArray<2UL>::operator=(in_RSI,in_RDX);
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        map_[key] = std::move(value);
    }